

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads(void)

{
  operator_new_fptr = threadsafe_mem_leak_operator_new;
  operator_new_nothrow_fptr = threadsafe_mem_leak_operator_new_nothrow;
  operator_new_debug_fptr = threadsafe_mem_leak_operator_new_debug;
  operator_new_array_fptr = threadsafe_mem_leak_operator_new_array;
  operator_new_array_nothrow_fptr = threadsafe_mem_leak_operator_new_array_nothrow;
  operator_new_array_debug_fptr = threadsafe_mem_leak_operator_new_array_debug;
  operator_delete_fptr = threadsafe_mem_leak_operator_delete;
  operator_delete_array_fptr = threadsafe_mem_leak_operator_delete_array;
  malloc_fptr = threadsafe_mem_leak_malloc;
  realloc_fptr = threadsafe_mem_leak_realloc;
  free_fptr = threadsafe_mem_leak_free;
  return;
}

Assistant:

void MemoryLeakWarningPlugin::turnOnThreadSafeNewDeleteOverloads()
{
#if CPPUTEST_USE_MEM_LEAK_DETECTION
    operator_new_fptr = threadsafe_mem_leak_operator_new;
    operator_new_nothrow_fptr = threadsafe_mem_leak_operator_new_nothrow;
    operator_new_debug_fptr = threadsafe_mem_leak_operator_new_debug;
    operator_new_array_fptr = threadsafe_mem_leak_operator_new_array;
    operator_new_array_nothrow_fptr = threadsafe_mem_leak_operator_new_array_nothrow;
    operator_new_array_debug_fptr = threadsafe_mem_leak_operator_new_array_debug;
    operator_delete_fptr = threadsafe_mem_leak_operator_delete;
    operator_delete_array_fptr = threadsafe_mem_leak_operator_delete_array;
    malloc_fptr = threadsafe_mem_leak_malloc;
    realloc_fptr = threadsafe_mem_leak_realloc;
    free_fptr = threadsafe_mem_leak_free;
#endif
}